

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O3

void __thiscall BackwardPass::CollectCloneStrCandidate(BackwardPass *this,Opnd *opnd)

{
  _func_int **pp_Var1;
  code *pcVar2;
  OpndKind OVar3;
  bool bVar4;
  undefined4 *puVar5;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  
  OVar3 = IR::Opnd::GetKind(opnd);
  if (OVar3 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar4) goto LAB_003e8372;
    *puVar5 = 0;
  }
  if ((((this->tag != BackwardPhase) || (this->currentInstr->m_opcode != Add_A)) ||
      (this->currentInstr->m_src1 != opnd)) ||
     (((this->currentPrePassLoop != (Loop *)0x0 || (this->isCollectionPass != false)) ||
      (this->currentBlock->loop == (Loop *)0x0)))) {
    return;
  }
  pp_Var1 = opnd[1]._vptr_Opnd;
  this_00 = this->currentBlock->cloneStrCandidates;
  if (this_00 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x184d,"(currentBlock->cloneStrCandidates != nullptr)",
                       "currentBlock->cloneStrCandidates != nullptr");
    if (!bVar4) {
LAB_003e8372:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
    this_00 = this->currentBlock->cloneStrCandidates;
  }
  BVSparse<Memory::JitArenaAllocator>::Set(this_00,*(BVIndex *)(pp_Var1 + 2));
  return;
}

Assistant:

void
BackwardPass::CollectCloneStrCandidate(IR::Opnd * opnd)
{
    IR::RegOpnd *regOpnd = opnd->AsRegOpnd();
    Assert(regOpnd != nullptr);
    StackSym *sym = regOpnd->m_sym;

    if (tag == Js::BackwardPhase
        && currentInstr->m_opcode == Js::OpCode::Add_A
        && currentInstr->GetSrc1() == opnd
        && !this->IsPrePass()
        && !this->IsCollectionPass()
        &&  this->currentBlock->loop)
    {
        Assert(currentBlock->cloneStrCandidates != nullptr);

        currentBlock->cloneStrCandidates->Set(sym->m_id);
    }
}